

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibraryinfo.cpp
# Opt level: O0

QStringList * QLibraryInfo::platformPluginArguments(QString *platformName)

{
  long lVar1;
  QAnyStringView key_00;
  bool bVar2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RDI;
  long in_FS_OFFSET;
  QString key;
  unique_ptr<QSettings,_std::default_delete<QSettings>_> settings;
  QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>
  *in_stack_ffffffffffffff08;
  QStringBuilder<QLatin1String,_const_QString_&> *in_stack_ffffffffffffff10;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  size_t in_stack_ffffffffffffff48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  aVar3 = in_RDI;
  findConfiguration();
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QSettings,_std::default_delete<QSettings>_> *)0x23a74c);
  if (bVar2) {
    Qt::Literals::StringLiterals::operator____L1
              (in_RDI.m_data_utf8,(size_t)in_stack_ffffffffffffff10);
    ::operator+(&in_stack_ffffffffffffff10->a,(QString *)in_stack_ffffffffffffff08);
    Qt::Literals::StringLiterals::operator____L1
              (in_RDI.m_data_utf8,(size_t)in_stack_ffffffffffffff10);
    ::operator+(in_stack_ffffffffffffff10,(QLatin1String *)in_stack_ffffffffffffff08);
    ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff10 =
         (QStringBuilder<QLatin1String,_const_QString_&> *)
         std::unique_ptr<QSettings,_std::default_delete<QSettings>_>::operator->
                   ((unique_ptr<QSettings,_std::default_delete<QSettings>_> *)0x23a7ff);
    QAnyStringView::QAnyStringView((QAnyStringView *)this.m_data,(QString *)in_RDI.m_data);
    key_00.m_size = in_stack_ffffffffffffff48;
    key_00.field_0.m_data = aVar3.m_data;
    QSettings::value((QSettings *)this.m_data,key_00);
    ::QVariant::toStringList((QVariant *)in_stack_ffffffffffffff08);
    ::QVariant::~QVariant((QVariant *)in_stack_ffffffffffffff10);
    QString::~QString((QString *)0x23a86a);
  }
  std::unique_ptr<QSettings,_std::default_delete<QSettings>_>::~unique_ptr
            ((unique_ptr<QSettings,_std::default_delete<QSettings>_> *)in_stack_ffffffffffffff10);
  if (!bVar2) {
    memset(in_RDI.m_data,0,0x18);
    QList<QString>::QList((QList<QString> *)0x23a901);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QStringList *)this.m_data;
}

Assistant:

QStringList QLibraryInfo::platformPluginArguments(const QString &platformName)
{
#if QT_CONFIG(settings)
    if (const auto settings = findConfiguration()) {
        const QString key = "Platforms/"_L1
                + platformName
                + "Arguments"_L1;
        return settings->value(key).toStringList();
    }
#else
    Q_UNUSED(platformName);
#endif // settings
    return QStringList();
}